

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

bool CLI::detail::valid_alias_name_string(string *str)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&valid_alias_name_string(std::__cxx11::string_const&)::
                                 badChars_abi_cxx11_);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"\n","");
      ::std::operator+(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                       &local_30,'\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      __cxa_atexit(::std::__cxx11::string::~string,
                   &valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_
                         );
    }
  }
  lVar2 = ::std::__cxx11::string::find_first_of
                    ((char *)str,
                     (ulong)valid_alias_name_string(std::__cxx11::string_const&)::
                            badChars_abi_cxx11_._M_dataplus._M_p,0);
  return lVar2 == -1;
}

Assistant:

inline bool valid_alias_name_string(const std::string &str) {
    static const std::string badChars(std::string("\n") + '\0');
    return (str.find_first_of(badChars) == std::string::npos);
}